

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestUpdateHandler.cxx
# Opt level: O0

bool __thiscall cmCTestUpdateHandler::SelectVCS(cmCTestUpdateHandler *this)

{
  cmCTest *pcVar1;
  int iVar2;
  string *dir;
  char *pcVar3;
  char *type;
  ulong uVar4;
  ostream *poVar5;
  string local_468 [32];
  string local_448 [32];
  undefined1 local_428 [8];
  ostringstream cmCTestLog_msg;
  undefined1 local_2b0 [8];
  ostringstream e;
  allocator<char> local_131;
  string local_130;
  string local_110;
  char *local_f0;
  char *key;
  string local_e0;
  string local_c0;
  allocator<char> local_99;
  string local_98;
  cmValue local_78 [3];
  allocator<char> local_59;
  string local_58;
  string local_38;
  cmCTestUpdateHandler *local_18;
  cmCTestUpdateHandler *this_local;
  
  pcVar1 = (this->super_cmCTestGenericHandler).CTest;
  local_18 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"UpdateCommand",&local_59);
  cmCTest::GetCTestConfiguration(&local_38,pcVar1,&local_58);
  std::__cxx11::string::operator=((string *)&this->UpdateCommand,(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator(&local_59);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"SourceDirectory",&local_99);
  local_78[0] = cmCTestGenericHandler::GetOption(&this->super_cmCTestGenericHandler,&local_98);
  dir = cmValue::operator_cast_to_string_(local_78);
  iVar2 = DetectVCS(this,dir);
  this->UpdateType = iVar2;
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator(&local_99);
  if (this->UpdateType == 0) {
    pcVar3 = (char *)std::__cxx11::string::c_str();
    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_e0,"UpdateType",(allocator<char> *)((long)&key + 7));
    cmCTest::GetCTestConfiguration(&local_c0,pcVar1,&local_e0);
    type = (char *)std::__cxx11::string::c_str();
    iVar2 = DetermineType(this,pcVar3,type);
    this->UpdateType = iVar2;
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_e0);
    std::allocator<char>::~allocator((allocator<char> *)((long)&key + 7));
  }
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) != 0) {
    local_f0 = (char *)0x0;
    switch(this->UpdateType) {
    case 1:
      local_f0 = "CVSCommand";
      break;
    case 2:
      local_f0 = "SVNCommand";
      break;
    case 3:
      local_f0 = "BZRCommand";
      break;
    case 4:
      local_f0 = "GITCommand";
      break;
    case 5:
      local_f0 = "HGCommand";
      break;
    case 6:
      local_f0 = "P4Command";
    }
    pcVar3 = local_f0;
    if (local_f0 != (char *)0x0) {
      pcVar1 = (this->super_cmCTestGenericHandler).CTest;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_130,pcVar3,&local_131);
      cmCTest::GetCTestConfiguration(&local_110,pcVar1,&local_130);
      std::__cxx11::string::operator=((string *)&this->UpdateCommand,(string *)&local_110);
      std::__cxx11::string::~string((string *)&local_110);
      std::__cxx11::string::~string((string *)&local_130);
      std::allocator<char>::~allocator(&local_131);
    }
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) != 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2b0);
      std::operator<<((ostream *)local_2b0,"Cannot find UpdateCommand ");
      if (local_f0 != (char *)0x0) {
        poVar5 = std::operator<<((ostream *)local_2b0,"or ");
        std::operator<<(poVar5,local_f0);
      }
      std::operator<<((ostream *)local_2b0," configuration key.");
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_428);
      std::__cxx11::ostringstream::str();
      poVar5 = std::operator<<((ostream *)local_428,local_448);
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string(local_448);
      pcVar1 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::ostringstream::str();
      pcVar3 = (char *)std::__cxx11::string::c_str();
      cmCTest::Log(pcVar1,7,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestUpdateHandler.cxx"
                   ,0x15c,pcVar3,false);
      std::__cxx11::string::~string(local_468);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_428);
      this_local._7_1_ = 0;
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2b0);
      goto LAB_00a134f8;
    }
  }
  this_local._7_1_ = 1;
LAB_00a134f8:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmCTestUpdateHandler::SelectVCS()
{
  // Get update command
  this->UpdateCommand = this->CTest->GetCTestConfiguration("UpdateCommand");

  // Detect the VCS managing the source tree.
  this->UpdateType = this->DetectVCS(this->GetOption("SourceDirectory"));
  if (this->UpdateType == e_UNKNOWN) {
    // The source tree does not have a recognized VCS.  Check the
    // configuration value or command name.
    this->UpdateType = this->DetermineType(
      this->UpdateCommand.c_str(),
      this->CTest->GetCTestConfiguration("UpdateType").c_str());
  }

  // If no update command was specified, lookup one for this VCS tool.
  if (this->UpdateCommand.empty()) {
    const char* key = nullptr;
    switch (this->UpdateType) {
      case e_CVS:
        key = "CVSCommand";
        break;
      case e_SVN:
        key = "SVNCommand";
        break;
      case e_BZR:
        key = "BZRCommand";
        break;
      case e_GIT:
        key = "GITCommand";
        break;
      case e_HG:
        key = "HGCommand";
        break;
      case e_P4:
        key = "P4Command";
        break;
      default:
        break;
    }
    if (key) {
      this->UpdateCommand = this->CTest->GetCTestConfiguration(key);
    }
    if (this->UpdateCommand.empty()) {
      std::ostringstream e;
      e << "Cannot find UpdateCommand ";
      if (key) {
        e << "or " << key;
      }
      e << " configuration key.";
      cmCTestLog(this->CTest, ERROR_MESSAGE, e.str() << std::endl);
      return false;
    }
  }

  return true;
}